

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

DdManager *
Llb_NonlinImageStart
          (Aig_Man_t *pAig,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vRoots,int *pVars2Q,int *pOrder,int fFirst,
          abctime TimeTarget)

{
  uint numVars;
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  DdManager *dd;
  int fFirst_local;
  int *pOrder_local;
  int *pVars2Q_local;
  Vec_Ptr_t *vRoots_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Man_t *pAig_local;
  
  aVar2 = Abc_Clock();
  if (p == (Llb_Mgr_t *)0x0) {
    numVars = Aig_ManObjNumMax(pAig);
    pAig_local = (Aig_Man_t *)Cudd_Init(numVars,0,0x100,0x40000,0);
    ((DdManager *)pAig_local)->TimeStop = TimeTarget;
    Cudd_ShuffleHeap((DdManager *)pAig_local,pOrder);
    Cudd_AutodynEnable((DdManager *)pAig_local,CUDD_REORDER_SYMM_SIFT);
    p = Llb_NonlinAlloc(pAig,vLeaves,vRoots,pVars2Q,(DdManager *)pAig_local);
    iVar1 = Llb_NonlinStart(p);
    if (iVar1 == 0) {
      Llb_NonlinFree(p);
      p = (Llb_Mgr_t *)0x0;
      pAig_local = (Aig_Man_t *)0x0;
    }
    else {
      aVar3 = Abc_Clock();
      timeBuild = (aVar3 - aVar2) + timeBuild;
    }
    return (DdManager *)pAig_local;
  }
  __assert_fail("p == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                ,0x3c7,
                "DdManager *Llb_NonlinImageStart(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, int *, int *, int, abctime)"
               );
}

Assistant:

DdManager * Llb_NonlinImageStart( Aig_Man_t * pAig, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, int * pVars2Q, int * pOrder, int fFirst, abctime TimeTarget )
{
    DdManager * dd;
    abctime clk = Abc_Clock();
    assert( p == NULL );
    // start a new manager (disable reordering)
    dd = Cudd_Init( Aig_ManObjNumMax(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    dd->TimeStop = TimeTarget;
    Cudd_ShuffleHeap( dd, pOrder );
//    if ( fFirst )
        Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    // start the manager
    p = Llb_NonlinAlloc( pAig, vLeaves, vRoots, pVars2Q, dd );
    if ( !Llb_NonlinStart( p ) )
    {
        Llb_NonlinFree( p );
        p = NULL;
        return NULL;
    }
    timeBuild += Abc_Clock() - clk;
//    if ( !fFirst )
//        Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    return dd;
}